

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O0

bool llvm::detail::HelperFunctions::consumeHexStyle(StringRef *Str,HexPrintStyle *Style)

{
  HexPrintStyle *pHVar1;
  bool bVar2;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  StringRef local_30;
  HexPrintStyle *local_20;
  HexPrintStyle *Style_local;
  StringRef *Str_local;
  
  local_20 = Style;
  Style_local = (HexPrintStyle *)Str;
  StringRef::StringRef(&local_30,"x");
  bVar2 = StringRef::startswith_lower(Str,local_30);
  pHVar1 = Style_local;
  if (!bVar2) {
    return false;
  }
  StringRef::StringRef(&local_40,"x-");
  bVar2 = StringRef::consume_front((StringRef *)pHVar1,local_40);
  pHVar1 = Style_local;
  if (bVar2) {
    *local_20 = Lower;
  }
  else {
    StringRef::StringRef(&local_50,"X-");
    bVar2 = StringRef::consume_front((StringRef *)pHVar1,local_50);
    pHVar1 = Style_local;
    if (bVar2) {
      *local_20 = Upper;
    }
    else {
      StringRef::StringRef(&local_60,"x+");
      bVar2 = StringRef::consume_front((StringRef *)pHVar1,local_60);
      pHVar1 = Style_local;
      if (!bVar2) {
        StringRef::StringRef(&local_70,"x");
        bVar2 = StringRef::consume_front((StringRef *)pHVar1,local_70);
        pHVar1 = Style_local;
        if (!bVar2) {
          StringRef::StringRef(&local_80,"X+");
          bVar2 = StringRef::consume_front((StringRef *)pHVar1,local_80);
          pHVar1 = Style_local;
          if (!bVar2) {
            StringRef::StringRef(&local_90,"X");
            bVar2 = StringRef::consume_front((StringRef *)pHVar1,local_90);
            if (!bVar2) {
              return true;
            }
          }
          *local_20 = PrefixUpper;
          return true;
        }
      }
      *local_20 = PrefixLower;
    }
  }
  return true;
}

Assistant:

static bool consumeHexStyle(StringRef &Str, HexPrintStyle &Style) {
    if (!Str.startswith_lower("x"))
      return false;

    if (Str.consume_front("x-"))
      Style = HexPrintStyle::Lower;
    else if (Str.consume_front("X-"))
      Style = HexPrintStyle::Upper;
    else if (Str.consume_front("x+") || Str.consume_front("x"))
      Style = HexPrintStyle::PrefixLower;
    else if (Str.consume_front("X+") || Str.consume_front("X"))
      Style = HexPrintStyle::PrefixUpper;
    return true;
  }